

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall Logger::flush(Logger *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->l_mutex);
  if (iVar1 == 0) {
    fflush((FILE *)this->l_fp);
    pthread_mutex_unlock((pthread_mutex_t *)&this->l_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Logger::flush(void)
{
    lock_guard<mutex> lck (l_mutex);
    fflush(l_fp);
}